

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyfile.c
# Opt level: O1

econf_err getBoolValueNum(econf_file key_file,size_t num,_Bool *result)

{
  char *string;
  char *pcVar1;
  char *string_00;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  econf_err eVar5;
  
  string = strdup(key_file.file_entry[num].value);
  pcVar1 = toLowerCase(string);
  string_00 = toLowerCase(key_file.file_entry[num].value);
  sVar2 = hashstring(string_00);
  if ((((*pcVar1 == '1') && (sVar3 = strlen(string), sVar3 == 1)) ||
      (sVar4 = hashstring("yes"), sVar2 == sVar4)) || (sVar4 = hashstring("true"), sVar2 == sVar4))
  {
    *result = true;
  }
  else {
    if (((*pcVar1 != '\0') && ((*pcVar1 != '0' || (sVar3 = strlen(string), sVar3 != 1)))) &&
       ((sVar4 = hashstring("no"), sVar2 != sVar4 && (sVar4 = hashstring("false"), sVar2 != sVar4)))
       ) {
      sVar4 = hashstring("_none_");
      eVar5 = ECONF_PARSE_ERROR;
      if (sVar2 == sVar4) {
        eVar5 = ECONF_KEY_HAS_NULL_VALUE;
      }
      goto LAB_00106910;
    }
    *result = false;
  }
  eVar5 = ECONF_SUCCESS;
LAB_00106910:
  free(string);
  return eVar5;
}

Assistant:

econf_err getBoolValueNum(econf_file key_file, size_t num, bool *result) {
  char *value, *tmp;
  tmp = strdup(key_file.file_entry[num].value);
  value = toLowerCase(tmp);
  size_t hash = hashstring(toLowerCase(key_file.file_entry[num].value));
  econf_err err = ECONF_SUCCESS;

  if ((*value == '1' && strlen(tmp) == 1) || hash == YES || hash == TRUE)
    *result = true;
  else if ((*value == '0' && strlen(tmp) == 1) || !*value ||
	   hash == NO || hash == FALSE)
    *result = false;
  else if (hash == KEY_FILE_NULL_VALUE_HASH)
    err = ECONF_KEY_HAS_NULL_VALUE;
  else
    err = ECONF_PARSE_ERROR;

  free(tmp);
  return err;
}